

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> * __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::parseInto
          (CommandLine<Catch::ConfigData> *this,int argc,char **argv,ConfigData *config)

{
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens_00;
  undefined8 *in_RCX;
  ConfigData *in_RDI;
  Parser parser;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> tokens;
  size_t lastSlash;
  string processName;
  ConfigData *this_00;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *this_01;
  Parser *in_stack_ffffffffffffff40;
  ConfigData *in_stack_ffffffffffffff78;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
  *in_stack_ffffffffffffff80;
  CommandLine<Catch::ConfigData> *in_stack_ffffffffffffff88;
  char **in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffac;
  Parser *in_stack_ffffffffffffffb0;
  string local_48 [72];
  
  this_01 = (vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *)
            *in_RCX;
  this_00 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,(char *)this_01,(allocator *)&stack0xffffffffffffffb7);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
  tokens_00 = (vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *)
              std::__cxx11::string::find_last_of((char *)local_48,0x24c4df);
  if (tokens_00 !=
      (vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *)
      0xffffffffffffffff) {
    std::__cxx11::string::substr((ulong)&stack0xffffffffffffff78,(ulong)local_48);
    std::__cxx11::string::operator=(local_48,(string *)&stack0xffffffffffffff78);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
  }
  Detail::BoundArgFunction<Catch::ConfigData>::set
            ((BoundArgFunction<Catch::ConfigData> *)this_00,in_RDI,(string *)0x1d5d1e);
  std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::vector
            ((vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *)
             0x1d5d2a);
  Parser::Parser(in_stack_ffffffffffffff40);
  Parser::parseIntoTokens
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0,tokens_00
            );
  populate(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  Parser::~Parser((Parser *)0x1d5d7d);
  std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::~vector
            (this_01);
  std::__cxx11::string::~string(local_48);
  return (vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *)
         this_00;
}

Assistant:

std::vector<Parser::Token> parseInto( int argc, char const * const * argv, ConfigT& config ) const {
            std::string processName = argv[0];
            std::size_t lastSlash = processName.find_last_of( "/\\" );
            if( lastSlash != std::string::npos )
                processName = processName.substr( lastSlash+1 );
            m_boundProcessName.set( config, processName );
            std::vector<Parser::Token> tokens;
            Parser parser;
            parser.parseIntoTokens( argc, argv, tokens );
            return populate( tokens, config );
        }